

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void try_door(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  chunk_conflict *c_local;
  loc grid_local;
  
  _Var1 = square_in_bounds((chunk *)c,(loc_conflict)grid);
  if (_Var1) {
    _Var1 = square_isstrongwall((chunk *)c,(loc_conflict)grid);
    if ((((!_Var1) && (_Var1 = square_isroom((chunk *)c,(loc_conflict)grid), !_Var1)) &&
        (_Var1 = square_isplayertrap((chunk *)c,(loc_conflict)grid), !_Var1)) &&
       (_Var1 = square_isdoor((chunk *)c,(loc_conflict)grid), !_Var1)) {
      wVar2 = Rand_div(100);
      if ((wVar2 < (dun->profile->tun).jct) && (_Var1 = possible_doorway(c,grid), _Var1)) {
        place_random_door(c,grid);
      }
      else {
        wVar2 = Rand_div(500);
        if ((wVar2 < (dun->profile->tun).jct) && (_Var1 = possible_doorway(c,grid), _Var1)) {
          place_trap((chunk_conflict2 *)c,(loc_conflict)grid,L'\xffffffff',c->depth);
        }
      }
    }
    return;
  }
  __assert_fail("square_in_bounds(c, grid)",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-cave.c"
                ,0x33b,"void try_door(struct chunk *, struct loc)");
}

Assistant:

static void try_door(struct chunk *c, struct loc grid)
{
	assert(square_in_bounds(c, grid));

	if (square_isstrongwall(c, grid)) return;
	if (square_isroom(c, grid)) return;
	if (square_isplayertrap(c, grid)) return;
	if (square_isdoor(c, grid)) return;

	if (randint0(100) < dun->profile->tun.jct && possible_doorway(c, grid))
		place_random_door(c, grid);
	else if (randint0(500) < dun->profile->tun.jct && possible_doorway(c, grid))
		place_trap(c, grid, -1, c->depth);
}